

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result __thiscall
testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::Perform
          (Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *this,
          ArgumentTuple *args)

{
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  internal::
  ApplyImpl<std::function<void(std::shared_ptr<ot::commissioner::CommissionerApp>&)>const&,std::tuple<std::shared_ptr<ot::commissioner::CommissionerApp>&>,0ul>
            (this,args);
  return;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }